

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O0

int sys_onloadlist(char *classname)

{
  t_symbol *ptVar1;
  t_loadlist *local_28;
  t_loadlist *ll;
  t_symbol *s;
  char *classname_local;
  
  ptVar1 = gensym(classname);
  local_28 = sys_loaded;
  while( true ) {
    if (local_28 == (t_loadlist *)0x0) {
      return 0;
    }
    if (local_28->ll_name == ptVar1) break;
    local_28 = local_28->ll_next;
  }
  return 1;
}

Assistant:

int sys_onloadlist(const char *classname) /* return true if already loaded */
{
    t_symbol *s = gensym(classname);
    t_loadlist *ll;
    for (ll = sys_loaded; ll; ll = ll->ll_next)
        if (ll->ll_name == s)
            return (1);
    return (0);
}